

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cc
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  Size SVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  long *plVar9;
  long *plVar10;
  undefined8 uVar11;
  Size SVar12;
  size_type sVar13;
  uint __len;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> smiles;
  string img_name;
  string smile_name;
  Mat img;
  Mat image_gray;
  uint local_1e4;
  undefined1 local_1e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined8 local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  long *local_170 [2];
  long local_160 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [3];
  Mat local_90 [96];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nThis program demonstrates the smile detector.\nContains two functions:\n1.Converting Video Files to Pictures.\n2.Extract the smiling pictures from the pictures.\n\nUsage:\n./smile [--url=<the URL of the incoming video>]\n\nExample:\n./videocover http://vodm2lzexwq.vod.126.net/vodm2lzexwq/4673d4ae-7078-42c1-affb-494b4ad0e687.mp4?resId=254486990bfa2cd7aa860229db639341_1919639027_0&sign=i9VRqSZZJDUI%2B3hka7EpMg12silSgknLl2iTUoyqKT8%3D\n\n"
               ,0x1ad);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tUsing OpenCV version 4.0.1.\n\n\n",0x1f);
    return 0;
  }
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"smile.png","");
  iVar6 = download(argv[1],"video.mp4");
  if (iVar6 == -1) {
    printf("[%s][%s(%d)]:Download video error.\n","MSG_ERROR","main",0x34);
    uVar11 = 0x35;
  }
  else {
    printf("[%s][%s(%d)]:Download video successful!\n","MSG_INFO","main",0x38);
    iVar6 = mkdir("./video",0x1ff);
    if (iVar6 == -1) {
      printf("[%s][%s(%d)]:Create dir error!\n","MSG_ERROR","main",0x3b);
      uVar11 = 0x3c;
    }
    else {
      printf("[%s][%s(%d)]:Create dir successful!\n","MSG_INFO","main",0x3f);
      video_to_image("video.mp4","./video");
      printf("[%s][%s(%d)]:Video convert image successful!\n","MSG_INFO","main",0x46);
      local_1e4 = 1;
      do {
        std::operator+(local_f0,"./video",&forward_slash_abi_cxx11_);
        __len = 1;
        if (9 < local_1e4) {
          uVar7 = local_1e4;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_0010571f;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_0010571f;
            }
            if (uVar7 < 10000) goto LAB_0010571f;
            bVar3 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            uVar4 = __len + 4;
          } while (bVar3);
          __len = __len + 1;
        }
LAB_0010571f:
        local_1e0._0_8_ = local_1e0 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_1e0,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._0_8_,__len,local_1e4);
        uVar11._0_4_ = 0xf;
        uVar11._4_4_ = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          uVar11 = local_f0[0].field_2._M_allocated_capacity;
        }
        SVar2 = (Size)((long)&((_Alloc_hider *)local_1e0._8_8_)->_M_p + local_f0[0]._M_string_length
                      );
        if ((ulong)uVar11 < (ulong)SVar2) {
          SVar12.width = 0xf;
          SVar12.height = 0;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1e0 + 0x10)) {
            SVar12 = (Size)local_1e0._16_8_;
          }
          if ((ulong)SVar12 < (ulong)SVar2) goto LAB_001057a7;
          sVar13 = local_f0[0]._M_string_length;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)local_1e0,0,(char *)0x0,(ulong)local_f0[0]._M_dataplus._M_p);
          iVar6 = (int)sVar13;
        }
        else {
LAB_001057a7:
          sVar13 = local_f0[0]._M_string_length;
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_f0,local_1e0._0_8_);
          iVar6 = (int)sVar13;
        }
        local_150[0]._M_dataplus._M_p = (pointer)&local_150[0].field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_150[0].field_2._0_8_ = *psVar1;
          local_150[0].field_2._8_8_ = puVar8[3];
        }
        else {
          local_150[0].field_2._0_8_ = *psVar1;
          local_150[0]._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_150[0]._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_150,(ulong)suffix_png_abi_cxx11_._M_dataplus._M_p)
        ;
        plVar10 = plVar9 + 2;
        if ((long *)*plVar9 == plVar10) {
          local_198 = *plVar10;
          lStack_190 = plVar9[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar10;
          local_1a8 = (long *)*plVar9;
        }
        local_1a0 = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
          operator_delete(local_150[0]._M_dataplus._M_p,
                          local_150[0].field_2._M_allocated_capacity + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1e0 + 0x10))
        {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          operator_delete(local_f0[0]._M_dataplus._M_p,local_f0[0].field_2._M_allocated_capacity + 1
                         );
        }
        cv::imread((string *)local_150,(int)&local_1a8);
        cVar5 = cv::Mat::empty();
        if (cVar5 != '\0') {
          cv::Mat::~Mat((Mat *)local_150);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          break;
        }
        cv::Mat::Mat((Mat *)local_f0);
        local_1e0._16_4_ = 0;
        local_1e0._20_4_ = 0;
        local_1e0._0_4_ = 0x1010000;
        local_1b0 = 0;
        local_1c0._M_allocated_capacity._0_4_ = 0x2010000;
        local_1e0._8_8_ = local_150;
        local_1c0._8_8_ = local_f0;
        cv::cvtColor((cv *)local_1e0,(_InputArray *)&local_1c0,(_OutputArray *)0x6,0,iVar6);
        local_1e0._16_4_ = 0;
        local_1e0._20_4_ = 0;
        local_1e0._0_4_ = 0x1010000;
        local_1b0 = 0;
        local_1c0._M_allocated_capacity._0_4_ = 0x2010000;
        local_1e0._8_8_ = local_f0;
        local_1c0._8_8_ = local_f0;
        cv::equalizeHist((_InputArray *)local_1e0,(_OutputArray *)&local_1c0);
        cv::Mat::Mat(local_90,(Mat *)local_f0);
        detectSmile((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_1e0,local_90);
        cv::Mat::~Mat(local_90);
        if (local_1e0._0_8_ != local_1e0._8_8_) {
          local_1b0 = 0;
          local_1c0._M_allocated_capacity._0_4_ = 0x1010000;
          local_178 = 0;
          local_188 = (void *)0x0;
          uStack_180 = 0;
          local_1c0._8_8_ = local_150;
          cv::imwrite((string *)local_170,(_InputArray *)&local_1c0,(vector *)&local_188);
          if (local_188 != (void *)0x0) {
            operator_delete(local_188,local_178 - (long)local_188);
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ - local_1e0._0_8_);
        }
        cv::Mat::~Mat((Mat *)local_f0);
        cv::Mat::~Mat((Mat *)local_150);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        local_1e4 = local_1e4 + 1;
      } while (local_1e4 != 9999);
      printf("[%s][%s(%d)]:Smile detector successful!\n","MSG_INFO","main",0x58);
      iVar6 = __rmdir__("./video");
      if (iVar6 != -1) {
        iVar6 = 0;
        printf("[%s][%s(%d)]:Delete temp dir successful!\n","MSG_INFO","main",0x5f);
        goto LAB_00105b97;
      }
      printf("[%s][%s(%d)]:Delete temp dir error.\n","MSG_ERROR","main",0x5b);
      uVar11 = 0x5c;
    }
  }
  printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",uVar11);
  iVar6 = -1;
LAB_00105b97:
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, const char *argv[]) {
  if (argc < 2) {
    help();
    return 0;
  }
  const char *video_name = "video.mp4";
  const char *dir_name = "./video";
  string smile_name = "smile.png";
  if (download(argv[1], video_name) == -1) {
    lprintf(MSG_ERROR, "Download video error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Download video successful!\n");

  if (__mkdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Create dir error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Create dir successful!\n");

  if (video_to_image(video_name, dir_name) == -1) {
    lprintf(MSG_ERROR, "Video file conversion error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Video convert image successful!\n");

  // Read the image, convert it into gray image, and then equalize the
  // histogram.
  for (int i = 1; i < 9999; i++) {
    string img_name = dir_name + forward_slash + to_string(i) + suffix_png;

    Mat img = imread(img_name);
    if (img.empty()) break;

    Mat image_gray;
    cvtColor(img, image_gray, COLOR_BGR2GRAY);
    equalizeHist(image_gray, image_gray);

    vector<Rect> smiles = detectSmile(image_gray);

    if (!smiles.empty()) imwrite(smile_name, img);
  }
  lprintf(MSG_INFO, "Smile detector successful!\n");

  if (__rmdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Delete temp dir error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Delete temp dir successful!\n");

  return 0;
}